

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

void fold_1(__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3)

{
  undefined1 auVar1 [16];
  uint uVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __m128 ps_res;
  __m128 ps_crc3;
  __m128 ps_crc0;
  __m128i x_tmp3;
  __m128i xmm_fold4;
  __m128i *xmm_crc3_local;
  __m128i *xmm_crc2_local;
  __m128i *xmm_crc1_local;
  __m128i *xmm_crc0_local;
  
  auVar1 = vpinsrd_avx(ZEXT416(0xc6e41596),1,1);
  auVar1 = vpinsrd_avx(auVar1,0x54442bd4,2);
  auVar1 = vpinsrd_avx(auVar1,1,3);
  ps_res._8_8_ = auVar1._0_8_;
  ps_crc3._0_8_ = auVar1._8_8_;
  lVar8 = (*xmm_crc3)[0];
  lVar9 = (*xmm_crc3)[1];
  lVar10 = (*xmm_crc0)[1];
  (*xmm_crc3)[0] = (*xmm_crc0)[0];
  (*xmm_crc3)[1] = lVar10;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (*xmm_crc0)[1];
  auVar5._8_8_ = 0;
  auVar5._0_4_ = ps_res[2];
  auVar5._4_4_ = ps_res[3];
  alVar3[0] = 0;
  alVar3[1] = 0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar1 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      alVar3 = (__m128i)((undefined1  [16])alVar3 ^ auVar5 << uVar2);
    }
  }
  *xmm_crc0 = alVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (*xmm_crc3)[0];
  auVar7._8_8_ = 0;
  auVar7._0_4_ = ps_crc3[0];
  auVar7._4_4_ = ps_crc3[1];
  alVar4[0] = 0;
  alVar4[1] = 0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      alVar4 = (__m128i)((undefined1  [16])alVar4 ^ auVar7 << uVar2);
    }
  }
  *xmm_crc3 = alVar4;
  uVar11 = (*xmm_crc0)[0];
  uVar12 = (*xmm_crc0)[1];
  uVar13 = (*xmm_crc3)[0];
  uVar14 = (*xmm_crc3)[1];
  lVar10 = (*xmm_crc1)[1];
  (*xmm_crc0)[0] = (*xmm_crc1)[0];
  (*xmm_crc0)[1] = lVar10;
  lVar10 = (*xmm_crc2)[1];
  (*xmm_crc1)[0] = (*xmm_crc2)[0];
  (*xmm_crc1)[1] = lVar10;
  (*xmm_crc2)[0] = lVar8;
  (*xmm_crc2)[1] = lVar9;
  (*xmm_crc3)[0] = uVar11 ^ uVar13;
  (*xmm_crc3)[1] = uVar12 ^ uVar14;
  return;
}

Assistant:

static void fold_1(__m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2, __m128i *xmm_crc3) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    __m128i x_tmp3;
    __m128 ps_crc0, ps_crc3, ps_res;

    x_tmp3 = *xmm_crc3;

    *xmm_crc3 = *xmm_crc0;
    *xmm_crc0 = _mm_clmulepi64_si128(*xmm_crc0, xmm_fold4, 0x01);
    *xmm_crc3 = _mm_clmulepi64_si128(*xmm_crc3, xmm_fold4, 0x10);
    ps_crc0 = _mm_castsi128_ps(*xmm_crc0);
    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    ps_res = _mm_xor_ps(ps_crc0, ps_crc3);

    *xmm_crc0 = *xmm_crc1;
    *xmm_crc1 = *xmm_crc2;
    *xmm_crc2 = x_tmp3;
    *xmm_crc3 = _mm_castps_si128(ps_res);
}